

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

void __thiscall miniros::MasterLink::setRetryTimeout(MasterLink *this,WallDuration *timeout)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  
  if (this->internal_ != (Internal *)0x0) {
    WallDuration::WallDuration((WallDuration *)&local_38,0.0);
    bVar1 = DurationBase<miniros::WallDuration>::operator<
                      (&timeout->super_DurationBase<miniros::WallDuration>,(WallDuration *)&local_38
                      );
    if (bVar1) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setRetryTimeout::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"miniros.master_link",&local_39);
        console::initializeLogLocation(&setRetryTimeout::loc,&local_38,Fatal);
        std::__cxx11::string::~string((string *)&local_38);
      }
      if (setRetryTimeout::loc.level_ != Fatal) {
        console::setLogLocationLevel(&setRetryTimeout::loc,Fatal);
        console::checkLogLocationEnabled(&setRetryTimeout::loc);
      }
      if (setRetryTimeout::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,setRetryTimeout::loc.logger_,setRetryTimeout::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                       ,0x86,"void miniros::MasterLink::setRetryTimeout(miniros::WallDuration)",
                       "retry timeout must not be negative.");
      }
    }
    (this->internal_->retry_timeout).super_DurationBase<miniros::WallDuration> =
         timeout->super_DurationBase<miniros::WallDuration>;
  }
  return;
}

Assistant:

void MasterLink::setRetryTimeout(miniros::WallDuration timeout)
{
  if (!internal_)
    return;
  if (timeout < miniros::WallDuration(0)) {
    MINIROS_FATAL("retry timeout must not be negative.");
    MINIROS_BREAK();
  }
  internal_->retry_timeout = timeout;
}